

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (CodedInputStream *input,RepeatedField<int> *values)

{
  bool bVar1;
  Limit limit;
  int iVar2;
  int value;
  uint32 length;
  uint32 temp;
  uint32 local_34;
  uint32 local_30;
  uint32 local_2c;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_30);
  if (bVar1) {
    limit = io::CodedInputStream::PushLimit(input,local_30);
    while( true ) {
      iVar2 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar2 < 1) break;
      bVar1 = io::CodedInputStream::ReadVarint32(input,&local_2c);
      if (!bVar1) goto LAB_001fbea4;
      local_34 = local_2c;
      RepeatedField<int>::Add(values,(int *)&local_34);
    }
    io::CodedInputStream::PopLimit(input,limit);
    bVar1 = true;
  }
  else {
LAB_001fbea4:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::ReadPackedPrimitiveNoInline(io::CodedInputStream* input,
                                                 RepeatedField<CType>* values) {
  return ReadPackedPrimitive<CType, DeclaredType>(input, values);
}